

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_read_typed(void)

{
  int iVar1;
  
  _plan(0x2cc,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_read_typed");
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>(0xc,mp_read_int8,true);
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>(0x7f,mp_read_int8,true);
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>(0x80,mp_read_int8,false);
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>(-0xc,mp_read_int8,true);
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>(-0x80,mp_read_int8,true);
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>(-0x81,mp_read_int8,false);
  test_read_num<signed_char,float,int(*)(char_const**,signed_char*)>(-0.0003,mp_read_int8,false);
  test_read_num<signed_char,double,int(*)(char_const**,signed_char*)>(123.45,mp_read_int8,false);
  test_read_num_from_non_numeric_mp<signed_char,int(*)(char_const**,signed_char*)>(mp_read_int8);
  test_read_num<short,int,int(*)(char_const**,short*)>(0x7b,mp_read_int16,true);
  test_read_num<short,int,int(*)(char_const**,short*)>(0x7fff,mp_read_int16,true);
  test_read_num<short,int,int(*)(char_const**,short*)>(0x8000,mp_read_int16,false);
  test_read_num<short,int,int(*)(char_const**,short*)>(-0x7b,mp_read_int16,true);
  test_read_num<short,int,int(*)(char_const**,short*)>(-0x8000,mp_read_int16,true);
  test_read_num<short,int,int(*)(char_const**,short*)>(-0x8001,mp_read_int16,false);
  test_read_num<short,float,int(*)(char_const**,short*)>(-0.002,mp_read_int16,false);
  test_read_num<short,double,int(*)(char_const**,short*)>(12.345,mp_read_int16,false);
  test_read_num_from_non_numeric_mp<short,int(*)(char_const**,short*)>(mp_read_int16);
  test_read_num<int,int,int(*)(char_const**,int*)>(0x7b,mp_read_int32,true);
  test_read_num<int,int,int(*)(char_const**,int*)>(0x3039,mp_read_int32,true);
  test_read_num<int,int,int(*)(char_const**,int*)>(0x7fffffff,mp_read_int32,true);
  test_read_num<int,long,int(*)(char_const**,int*)>(0x80000000,mp_read_int32,false);
  test_read_num<int,int,int(*)(char_const**,int*)>(-0x7b,mp_read_int32,true);
  test_read_num<int,int,int(*)(char_const**,int*)>(-0x3039,mp_read_int32,true);
  test_read_num<int,long,int(*)(char_const**,int*)>(-0x80000000,mp_read_int32,true);
  test_read_num<int,long_long,int(*)(char_const**,int*)>(-0x80000001,mp_read_int32,false);
  test_read_num<int,float,int(*)(char_const**,int*)>(-100.0,mp_read_int32,false);
  test_read_num<int,double,int(*)(char_const**,int*)>(1.2345,mp_read_int32,false);
  test_read_num_from_non_numeric_mp<int,int(*)(char_const**,int*)>(mp_read_int32);
  test_read_num<long,int,int(*)(char_const**,long*)>(0x7b,mp_read_int64,true);
  test_read_num<long,int,int(*)(char_const**,long*)>(0x3039,mp_read_int64,true);
  test_read_num<long,int,int(*)(char_const**,long*)>(0x75bcd15,mp_read_int64,true);
  test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
            (0x7fffffffffffffff,mp_read_int64,true);
  test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
            (0x8000000000000000,mp_read_int64,false);
  test_read_num<long,int,int(*)(char_const**,long*)>(-0x7b,mp_read_int64,true);
  test_read_num<long,int,int(*)(char_const**,long*)>(-0x3039,mp_read_int64,true);
  test_read_num<long,int,int(*)(char_const**,long*)>(-0x75bcd15,mp_read_int64,true);
  test_read_num<long,long_long,int(*)(char_const**,long*)>(-0x7fffffffffffffff,mp_read_int64,true);
  test_read_num<long,float,int(*)(char_const**,long*)>(100.0,mp_read_int64,false);
  test_read_num<long,double,int(*)(char_const**,long*)>(-5.4321,mp_read_int64,false);
  test_read_num_from_non_numeric_mp<long,int(*)(char_const**,long*)>(mp_read_int64);
  test_read_num<double,int,int(*)(char_const**,double*)>(0x7b,mp_read_double,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(0x3039,mp_read_double,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(0x75bcd15,mp_read_double,true);
  test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
            (0x11f71fb0450,mp_read_double,true);
  test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
            (0x1b69b4bacd05f15,mp_read_double,false);
  test_read_num<double,int,int(*)(char_const**,double*)>(-0x7b,mp_read_double,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(-0x3039,mp_read_double,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(-0x75bcd15,mp_read_double,true);
  test_read_num<double,long_long,int(*)(char_const**,double*)>(-0x11f71fb0450,mp_read_double,true);
  test_read_num<double,long_long,int(*)(char_const**,double*)>
            (-0x1b69b4bacd05f15,mp_read_double,false);
  test_read_num<double,float,int(*)(char_const**,double*)>(6.565e+06,mp_read_double,true);
  test_read_num<double,double,int(*)(char_const**,double*)>(-5.555,mp_read_double,true);
  test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>(mp_read_double);
  test_read_num<double,int,int(*)(char_const**,double*)>(0x7b,mp_read_double_lossy,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(0x3039,mp_read_double_lossy,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(0x75bcd15,mp_read_double_lossy,true);
  test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
            (0x11f71fb0450,mp_read_double_lossy,true);
  test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
            (0x1b69b4bacd05f15,mp_read_double_lossy,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(-0x7b,mp_read_double_lossy,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(-0x3039,mp_read_double_lossy,true);
  test_read_num<double,int,int(*)(char_const**,double*)>(-0x75bcd15,mp_read_double_lossy,true);
  test_read_num<double,long_long,int(*)(char_const**,double*)>
            (-0x11f71fb0450,mp_read_double_lossy,true);
  test_read_num<double,long_long,int(*)(char_const**,double*)>
            (-0x1b69b4bacd05f15,mp_read_double_lossy,true);
  test_read_num<double,float,int(*)(char_const**,double*)>(6.565e+06,mp_read_double_lossy,true);
  test_read_num<double,double,int(*)(char_const**,double*)>(-5.555,mp_read_double_lossy,true);
  test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>(mp_read_double_lossy);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_read_typed");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_mp_read_typed()
{
	plan(716);
	header();

	test_read_int8(12, true);
	test_read_int8(127, true);
	test_read_int8(128, false);
	test_read_int8(-12, true);
	test_read_int8(-128, true);
	test_read_int8(-129, false);
	test_read_int8(-3e-4f, false);
	test_read_int8(123.45, false);
	test_read_num_from_non_numeric_mp<int8_t>(mp_read_int8);

	test_read_int16(123, true);
	test_read_int16(32767, true);
	test_read_int16(32768, false);
	test_read_int16(-123, true);
	test_read_int16(-32768, true);
	test_read_int16(-32769, false);
	test_read_int16(-2e-3f, false);
	test_read_int16(12.345, false);
	test_read_num_from_non_numeric_mp<int16_t>(mp_read_int16);

	test_read_int32(123, true);
	test_read_int32(12345, true);
	test_read_int32(2147483647, true);
	test_read_int32(2147483648, false);
	test_read_int32(-123, true);
	test_read_int32(-12345, true);
	test_read_int32(-2147483648, true);
	test_read_int32(-2147483649LL, false);
	test_read_int32(-1e2f, false);
	test_read_int32(1.2345, false);
	test_read_num_from_non_numeric_mp<int32_t>(mp_read_int32);

	test_read_int64(123, true);
	test_read_int64(12345, true);
	test_read_int64(123456789, true);
	test_read_int64(9223372036854775807ULL, true);
	test_read_int64(9223372036854775808ULL, false);
	test_read_int64(-123, true);
	test_read_int64(-12345, true);
	test_read_int64(-123456789, true);
	test_read_int64(-9223372036854775807LL, true);
	test_read_int64(100.0f, false);
	test_read_int64(-5.4321, false);
	test_read_num_from_non_numeric_mp<int64_t>(mp_read_int64);

	test_read_double(123, true);
	test_read_double(12345, true);
	test_read_double(123456789, true);
	test_read_double(1234567890000ULL, true);
	test_read_double(123456789123456789ULL, false);
	test_read_double(-123, true);
	test_read_double(-12345, true);
	test_read_double(-123456789, true);
	test_read_double(-1234567890000LL, true);
	test_read_double(-123456789123456789LL, false);
	test_read_double(6.565e6f, true);
	test_read_double(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double);

	test_read_double_lossy(123, true);
	test_read_double_lossy(12345, true);
	test_read_double_lossy(123456789, true);
	test_read_double_lossy(1234567890000ULL, true);
	test_read_double_lossy(123456789123456789ULL, true);
	test_read_double_lossy(-123, true);
	test_read_double_lossy(-12345, true);
	test_read_double_lossy(-123456789, true);
	test_read_double_lossy(-1234567890000LL, true);
	test_read_double_lossy(-123456789123456789LL, true);
	test_read_double_lossy(6.565e6f, true);
	test_read_double_lossy(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double_lossy);

	footer();
	return check_plan();
}